

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall cppwinrt::reader::values_abi_cxx11_(reader *this,string_view *name)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  const_iterator result;
  string_view *name_local;
  reader *this_local;
  
  result._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::find(&this->m_options,name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end(&this->m_options);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    if (values[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>const&)::
        empty_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&values[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>const&)
                                   ::empty_abi_cxx11_);
      if (iVar2 != 0) {
        memset(&values[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>const&)::
                empty_abi_cxx11_,0,0x18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&values[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>const&)::
                  empty_abi_cxx11_);
        __cxa_atexit(std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~vector,
                     &values[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>const&)::
                      empty_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&values[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>const&)
                             ::empty_abi_cxx11_);
      }
    }
    this_local = (reader *)
                 &values[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>const&)::
                  empty_abi_cxx11_;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(&local_28);
    this_local = (reader *)&ppVar3->second;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_local;
}

Assistant:

auto const& values(std::string_view const& name) const noexcept
        {
            auto result = m_options.find(name);

            if (result == m_options.end())
            {
                static std::vector<std::string> empty{};
                return empty;
            }

            return result->second;
        }